

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldIteratorTest_ConstIteration_Test::TestBody
          (RepeatedPtrFieldIteratorTest_ConstIteration_Test *this)

{
  bool bVar1;
  const_iterator it1;
  reference pbVar2;
  char *pcVar3;
  iterator *this_00;
  char *in_R9;
  AssertHelper local_120;
  Message local_118;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_d8;
  Message local_d0;
  iterator local_c8;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_2;
  Message local_80;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  const_iterator iter;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *const_proto_array;
  RepeatedPtrFieldIteratorTest_ConstIteration_Test *this_local;
  
  iter.it_ = (void **)&(this->super_RepeatedPtrFieldIteratorTest).proto_array_;
  it1 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::begin((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)iter.it_);
  local_20.it_ = it1.it_;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::cbegin((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)iter.it_);
  internal::operator-((iterator)it1.it_,
                      (iterator)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  pbVar2 = internal::
           RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&local_20);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_40,"\"foo\"","*iter",(char (*) [4])0x1d63234,pbVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x49e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  internal::
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator++(&local_20);
  local_78.it_ = (void **)internal::
                          RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator++(&local_20,0);
  pbVar2 = internal::
           RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&local_78);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_70,"\"bar\"","*(iter++)",(char (*) [4])0x1eb01d8,pbVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x4a0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  pbVar2 = internal::
           RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&local_20);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_98,"\"baz\"","*iter",(char (*) [4])0x1eb0148,pbVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x4a1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  internal::
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator++(&local_20);
  local_c8.it_ = (void **)RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::end(iter.it_);
  local_b9 = internal::operator==(&local_c8,&local_20);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_b8,
               (AssertionResult *)"const_proto_array.end() == iter","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x4a3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  local_110.it_ =
       (void **)RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::end(iter.it_);
  this_00 = internal::
            RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator--(&local_110);
  pbVar2 = internal::
           RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(this_00);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_108,"\"baz\"","*(--const_proto_array.end())",(char (*) [4])0x1eb0148,
             pbVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x4a4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  return;
}

Assistant:

TEST_F(RepeatedPtrFieldIteratorTest, ConstIteration) {
  const RepeatedPtrField<std::string>& const_proto_array = proto_array_;
  RepeatedPtrField<std::string>::const_iterator iter =
      const_proto_array.begin();
  iter - const_proto_array.cbegin();
  EXPECT_EQ("foo", *iter);
  ++iter;
  EXPECT_EQ("bar", *(iter++));
  EXPECT_EQ("baz", *iter);
  ++iter;
  EXPECT_TRUE(const_proto_array.end() == iter);
  EXPECT_EQ("baz", *(--const_proto_array.end()));
}